

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  cJSON *pcVar7;
  cJSON *pcVar8;
  cJSON *pcVar9;
  
  pcVar8 = (cJSON *)(*cJSON_malloc)(0x40);
  if (pcVar8 != (cJSON *)0x0) {
    pcVar8->valuedouble = 0.0;
    pcVar8->string = (char *)0x0;
    pcVar8->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar8->valueint = 0;
    pcVar8->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar8->type = 0;
    pcVar8->next = (cJSON *)0x0;
    pcVar8->prev = (cJSON *)0x0;
    pcVar7 = item->next;
    pcVar9 = item->prev;
    iVar3 = item->type;
    uVar4 = *(undefined4 *)&item->field_0x1c;
    pcVar2 = item->valuestring;
    iVar5 = item->valueint;
    uVar6 = *(undefined4 *)&item->field_0x2c;
    pcVar8->child = item->child;
    pcVar8->type = iVar3;
    *(undefined4 *)&pcVar8->field_0x1c = uVar4;
    pcVar8->next = pcVar7;
    pcVar8->prev = pcVar9;
    pcVar8->valuestring = pcVar2;
    pcVar8->valueint = iVar5;
    *(undefined4 *)&pcVar8->field_0x2c = uVar6;
    pcVar8->valuedouble = item->valuedouble;
    pbVar1 = (byte *)((long)&pcVar8->type + 1);
    *pbVar1 = *pbVar1 | 1;
    pcVar8->next = (cJSON *)0x0;
    pcVar8->prev = (cJSON *)0x0;
    pcVar7 = array->child;
    if (array->child == (cJSON *)0x0) {
      array->child = pcVar8;
    }
    else {
      do {
        pcVar9 = pcVar7;
        pcVar7 = pcVar9->next;
      } while (pcVar9->next != (cJSON *)0x0);
      pcVar9->next = pcVar8;
      pcVar8->prev = pcVar9;
    }
  }
  return;
}

Assistant:

void	cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)						{cJSON_AddItemToArray(array,create_reference(item));}